

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase461::run()::__0>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_16_2_3597c7bd *func)

{
  anon_class_16_2_3597c7bd *func_local;
  
  capnp::_::anon_unknown_0::TestCase461::run::anon_class_16_2_3597c7bd::operator()
            ((anon_class_16_2_3597c7bd *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}